

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O1

zip_source_t * source_hole_create(char *fname,int flags,zip_error_t *error)

{
  void *__ptr;
  char *pcVar1;
  buffer_t *buffer;
  FILE *__stream;
  size_t sVar2;
  zip_uint8_t **ppzVar3;
  zip_uint8_t *pzVar4;
  int *piVar5;
  zip_source_t *pzVar6;
  ulong uVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  ulong local_4c;
  ulong local_38;
  
  __ptr = malloc(0x28);
  if (__ptr != (void *)0x0) {
    pcVar1 = strdup(fname);
    *(char **)((long)__ptr + 0x10) = pcVar1;
    if (pcVar1 != (char *)0x0) {
      buffer = (buffer_t *)malloc(0x28);
      if (buffer == (buffer_t *)0x0) {
        buffer = (buffer_t *)0x0;
      }
      else {
        buffer->fragment = (zip_uint8_t **)0x0;
        buffer->nfragments = 0;
        buffer->fragment_size = 0x2000;
        buffer->size = 0;
        buffer->offset = 0;
      }
      if (buffer == (buffer_t *)0x0) {
        buffer = (buffer_t *)0x0;
        zip_error_set(error,0xe,0);
      }
      else if ((flags & 8U) == 0) {
        __stream = fopen(fname,"rb");
        if (__stream == (FILE *)0x0) {
          piVar5 = __errno_location();
          if (((flags & 1U) != 0) && (*piVar5 == 2)) goto LAB_0010754a;
          buffer_free(buffer);
        }
        else {
          sVar2 = fread(&local_58,0x14,1,__stream);
          if (sVar2 == 1) {
            if (local_58 == 0x3048694e) {
              uVar7 = (ulong)(uStack_50 >> 0x18) | (((ulong)uStack_50 & 0xff0000) << 0x20) >> 0x28 |
                      (((ulong)uStack_50 & 0xff00) << 0x20) >> 0x18 |
                      (((ulong)uStack_50 & 0xff) << 0x20) >> 8 |
                      ((ulong)uStack_54 & 0xff000000) << 8 | ((ulong)uStack_54 & 0xff0000) << 0x18 |
                      ((ulong)uStack_54 & 0xff00) << 0x28 | CONCAT44(uStack_50,uStack_54) << 0x38;
              buffer->fragment_size = uVar7;
              uVar10 = local_4c >> 0x38 | (local_4c & 0xff000000000000) >> 0x28 |
                       (local_4c & 0xff0000000000) >> 0x18 | (local_4c & 0xff00000000) >> 8 |
                       (local_4c & 0xff000000) << 8 | (local_4c & 0xff0000) << 0x18 |
                       (local_4c & 0xff00) << 0x28 | local_4c << 0x38;
              buffer->size = uVar10;
              if (!CARRY8(uVar10,uVar7)) {
                uVar11 = (uVar10 + uVar7) - 1;
                uVar10 = uVar11 / uVar7;
                buffer->nfragments = uVar10;
                if (uVar10 >> 0x3d == 0) {
                  local_38 = uVar7;
                  ppzVar3 = (zip_uint8_t **)malloc(uVar10 * 8);
                  buffer->fragment = ppzVar3;
                  if (ppzVar3 != (zip_uint8_t **)0x0) {
                    if (local_38 <= uVar11) {
                      uVar7 = 0;
                      do {
                        buffer->fragment[uVar7] = (zip_uint8_t *)0x0;
                        uVar7 = uVar7 + 1;
                      } while (uVar7 < uVar10);
                      if (local_38 <= uVar11) {
                        uVar7 = 0;
                        do {
                          sVar2 = fread(&local_58,4,1,__stream);
                          if (sVar2 != 1) goto LAB_00107508;
                          if (local_58 == 0x3248694e) {
                            sVar2 = fread(&local_58,8,1,__stream);
                            if (sVar2 != 1) goto LAB_00107508;
                            uVar7 = uVar7 + ((ulong)(uStack_54 >> 0x18) |
                                             (((ulong)uStack_54 & 0xff0000) << 0x20) >> 0x28 |
                                             (((ulong)uStack_54 & 0xff00) << 0x20) >> 0x18 |
                                             (((ulong)uStack_54 & 0xff) << 0x20) >> 8 |
                                             ((ulong)local_58 & 0xff000000) << 8 |
                                             ((ulong)local_58 & 0xff0000) << 0x18 |
                                             ((ulong)local_58 & 0xff00) << 0x28 |
                                            CONCAT44(uStack_54,local_58) << 0x38);
                          }
                          else {
                            if (local_58 != 0x3148694e) goto LAB_00107519;
                            sVar2 = buffer->fragment_size;
                            pzVar4 = (zip_uint8_t *)malloc(sVar2);
                            buffer->fragment[uVar7] = pzVar4;
                            if (pzVar4 == (zip_uint8_t *)0x0) goto LAB_00107528;
                            sVar2 = fread(buffer->fragment[uVar7],sVar2,1,__stream);
                            if (sVar2 != 1) goto LAB_00107508;
                            uVar7 = uVar7 + 1;
                          }
                        } while (uVar7 < buffer->nfragments);
                      }
                    }
                    fclose(__stream);
                    goto LAB_0010754a;
                  }
                }
              }
LAB_00107528:
              uVar9 = 0xe;
              iVar8 = 0;
            }
            else {
LAB_00107519:
              uVar9 = 5;
              iVar8 = 0x16;
            }
          }
          else {
LAB_00107508:
            piVar5 = __errno_location();
            iVar8 = *piVar5;
            uVar9 = 5;
          }
          zip_error_set(error,uVar9,iVar8);
          buffer_free(buffer);
          fclose(__stream);
        }
        buffer = (buffer_t *)0x0;
      }
LAB_0010754a:
      *(buffer_t **)((long)__ptr + 0x18) = buffer;
      if (buffer == (buffer_t *)0x0) {
        free(__ptr);
        __ptr = (void *)0x0;
      }
      else {
        zip_error_init(__ptr);
        *(undefined8 *)((long)__ptr + 0x20) = 0;
      }
      goto LAB_00107570;
    }
    free(__ptr);
  }
  __ptr = (void *)0x0;
  zip_error_set(error,0xe,0);
LAB_00107570:
  if (__ptr == (void *)0x0) {
    return (zip_source_t *)0x0;
  }
  pzVar6 = (zip_source_t *)zip_source_function_create(source_hole_cb,__ptr,error);
  return pzVar6;
}

Assistant:

zip_source_t *
source_hole_create(const char *fname, int flags, zip_error_t *error) {
    hole_t *ud = hole_new(fname, flags, error);

    if (ud == NULL) {
	return NULL;
    }
    return zip_source_function_create(source_hole_cb, ud, error);
}